

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Detonation_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Detonation_PDU *this)

{
  pointer pKVar1;
  KString *pKVar2;
  ostream *poVar3;
  ulong uVar4;
  KINT32 Value;
  pointer pKVar5;
  ushort uVar6;
  KStringStream ss;
  KString local_408;
  KString local_3e8;
  KString local_3c8;
  KString *local_3a8;
  KString local_3a0;
  KString local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_((KString *)local_340,(Header7 *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Detonation PDU-\n",0x11);
  Warfare_Header::GetAsString_abi_cxx11_(&local_3e8,&this->super_Warfare_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Velocity:                 ",0x1a);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_408,&this->m_Velocity);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_408._M_dataplus._M_p,local_408._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"World Location:           ",0x1a);
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_3c8,&this->m_LocationWorldCoords);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_3c8._M_dataplus._M_p._1_7_,
                                              (char)local_3c8._M_dataplus._M_p),
                      local_3c8._M_string_length);
  (*(((this->m_pDescriptor).m_pRef)->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_360);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_360,local_358);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Entity Location:          ",0x1a);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_380,&this->m_LocationEntityCoords);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Detonation Result:        ",0x1a);
  DATA_TYPE::ENUMS::GetEnumAsStringDetonationResult_abi_cxx11_
            (&local_3a0,(ENUMS *)(ulong)this->m_ui8DetonationResult,Value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Num Articulation Params:  ",0x1a);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_3c8._M_dataplus._M_p._1_7_,(char)local_3c8._M_dataplus._M_p) !=
      &local_3c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_3c8._M_dataplus._M_p._1_7_,(char)local_3c8._M_dataplus._M_p),
                    local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  local_3a8 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  pKVar5 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar5 != pKVar1) {
    poVar3 = (ostream *)(local_340 + 0x10);
    do {
      (*(pKVar5->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_408);
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      local_3c8._M_dataplus._M_p._0_1_ = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_3c8,1);
      if (local_408._M_string_length != 0) {
        uVar6 = 1;
        uVar4 = 0;
        do {
          local_3c8._M_dataplus._M_p._0_1_ = local_408._M_dataplus._M_p[uVar4];
          if ((local_408._M_string_length - 1 == uVar4) ||
             ((char)local_3c8._M_dataplus._M_p != '\n')) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_3c8,1);
          }
          else {
            local_3c8._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_3c8,1);
            local_3c8._M_dataplus._M_p._0_1_ = '\t';
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_3c8,1);
          }
          uVar4 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar4 < local_408._M_string_length);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base(local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      pKVar5 = pKVar5 + 1;
    } while (pKVar5 != pKVar1);
  }
  pKVar2 = local_3a8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Detonation_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Detonation PDU-\n"
       << Warfare_Header::GetAsString()
       << "Velocity:                 " << m_Velocity.GetAsString()
       << "World Location:           " << m_LocationWorldCoords.GetAsString()
       << m_pDescriptor->GetAsString()
       << "Entity Location:          " << m_LocationEntityCoords.GetAsString()
       << "Detonation Result:        " << GetEnumAsStringDetonationResult( m_ui8DetonationResult ) << "\n"
       << "Num Articulation Params:  " << ( KUINT16 )m_ui8NumOfVariableParams
       << "\n";

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}